

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O2

ptr<log_store> __thiscall raft_functional_common::TestMgr::load_log_store(TestMgr *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  ptr<log_store> pVar1;
  
  std::__shared_ptr<nuraft::log_store,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<nuraft::inmem_log_store,void>
            ((__shared_ptr<nuraft::log_store,(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<nuraft::inmem_log_store,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x30));
  pVar1.super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<log_store>)pVar1.super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<log_store> load_log_store() {
        return curLogStore;
    }